

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O1

void __thiscall
matrix_sparse_row_test_const_iterators_Test::~matrix_sparse_row_test_const_iterators_Test
          (matrix_sparse_row_test_const_iterators_Test *this)

{
  pointer pdVar1;
  pointer piVar2;
  
  (this->super_matrix_sparse_row_test).super_Test._vptr_Test =
       (_func_int **)&PTR__matrix_sparse_row_test_001619f0;
  pdVar1 = (this->super_matrix_sparse_row_test).csr_data.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->super_matrix_sparse_row_test).csr_data.value.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  piVar2 = (this->super_matrix_sparse_row_test).csr_data.i_column.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_matrix_sparse_row_test).csr_data.i_column.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  piVar2 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_matrix_sparse_row_test).csr_data.row_offset.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x60);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, const_iterators) {
  const Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);

  auto it = row.begin();  // start of row 0
  EXPECT_EQ((*it).i_column(), 1);
  EXPECT_DOUBLE_EQ((*it).value(), 3.0);

  ++it;  // start of row 1
  EXPECT_EQ((*it).i_column(), 3);
  EXPECT_DOUBLE_EQ((*it).value(), 4.0);

  ++it;  // start of row 2
  EXPECT_EQ((*it).i_column(), 4);
  EXPECT_DOUBLE_EQ((*it).value(), 5.0);

  ++it;  // one past last row
  EXPECT_EQ(it, row.end());
}